

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfa.cc
# Opt level: O2

bool __thiscall
duckdb_re2::NFA::Search
          (NFA *this,StringPiece *text,StringPiece *const_context,bool anchored,bool longest,
          StringPiece *submatch,int nsubmatch)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  Inst *pIVar4;
  long lVar5;
  long lVar6;
  const_pointer pcVar7;
  Threadq *pTVar8;
  uint uVar9;
  char **__s;
  byte *p;
  Thread *pTVar10;
  ostream *poVar11;
  IndexValue *pIVar12;
  IndexValue *pIVar13;
  long lVar14;
  uint uVar15;
  byte *pbVar16;
  Threadq *runq;
  Threadq *nextq;
  bool bVar17;
  StringPiece context;
  ostringstream local_1a8 [376];
  
  if (this->start_ == 0) {
    return false;
  }
  context.data_ = const_context->data_;
  context.size_ = const_context->size_;
  if (context.data_ == (const_pointer)0x0) {
    context.data_ = text->data_;
    context.size_ = text->size_;
  }
  pcVar7 = context.data_;
  p = (byte *)text->data_;
  if (context.data_ <= p) {
    pbVar16 = p + text->size_;
    if (pbVar16 <= context.data_ + context.size_) {
      bVar1 = this->prog_->anchor_start_;
      if (((byte *)context.data_ != p & bVar1) != 0) {
        return false;
      }
      if (this->prog_->anchor_end_ == true) {
        if ((byte *)(context.data_ + context.size_) != pbVar16) {
          return false;
        }
        this->endmatch_ = true;
        longest = true;
      }
      if (-1 < nsubmatch) {
        uVar9 = nsubmatch * 2;
        this->ncapture_ = uVar9;
        this->longest_ = longest;
        if (nsubmatch == 0) {
          this->ncapture_ = 2;
          uVar9 = 2;
        }
        __s = (char **)operator_new__((ulong)uVar9 << 3);
        this->match_ = __s;
        memset(__s,0,(ulong)uVar9 << 3);
        this->matched_ = false;
        this->btext_ = pcVar7;
        this->etext_ = (char *)pbVar16;
        (this->q0_).size_ = 0;
        (this->q1_).size_ = 0;
        pTVar8 = &this->q1_;
        nextq = &this->q0_;
        do {
          runq = nextq;
          nextq = pTVar8;
          uVar9 = 0xffffffff;
          if (p < this->etext_) {
            uVar9 = (uint)*p;
          }
          uVar9 = Step(this,runq,nextq,uVar9,&context,(char *)p);
          runq->size_ = 0;
          pbVar16 = (byte *)this->etext_;
          if (uVar9 != 0) {
            iVar2 = this->ncapture_;
            goto LAB_00415e6e;
          }
          if (pbVar16 < p) goto LAB_00415efe;
          if (this->matched_ == false) {
            if (bVar1 == false && !anchored) {
              if ((((p < pbVar16) && (nextq->size_ == 0)) && (this->prog_->prefix_size_ != 0)) &&
                 (p = (byte *)Prog::PrefixAccel(this->prog_,p,(long)pbVar16 - (long)p),
                 p == (byte *)0x0)) {
                p = (byte *)this->etext_;
              }
            }
            else if (p != (byte *)text->data_) goto LAB_00415df3;
            pTVar10 = AllocThread(this);
            memmove(pTVar10->capture,this->match_,(long)this->ncapture_ << 3);
            *pTVar10->capture = (char *)p;
            uVar9 = 0xffffffff;
            if (p < this->etext_) {
              uVar9 = (uint)*p;
            }
            AddToThreadq(this,nextq,this->start_,uVar9,&context,(char *)p,pTVar10);
            iVar2 = (pTVar10->field_0).ref;
            (pTVar10->field_0).ref = iVar2 + -1;
            if (iVar2 < 2) {
              pTVar10->field_0 = (anon_union_8_2_62753a03_for_Thread_0)this->freelist_;
              this->freelist_ = pTVar10;
            }
          }
LAB_00415df3:
          if (nextq->size_ == 0) goto LAB_00415efe;
          bVar17 = p != (byte *)0x0;
          pTVar8 = runq;
          p = p + 1;
        } while (bVar17);
        Step(this,nextq,runq,-1,&context,(char *)0x0);
        nextq->size_ = 0;
        nextq = runq;
        goto LAB_00415efe;
      }
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      poVar11 = std::operator<<((ostream *)local_1a8,"Bad args: nsubmatch=");
      std::ostream::operator<<(poVar11,nsubmatch);
      goto LAB_00415c2f;
    }
  }
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::operator<<((ostream *)local_1a8,"context does not contain text");
LAB_00415c2f:
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return false;
LAB_00415e6e:
  pIVar4 = ((_Head_base<0UL,_duckdb_re2::Prog::Inst_*,_false> *)
           ((long)&(this->prog_->inst_).ptr_._M_t.
                   super___uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                   ._M_t.
                   super__Tuple_impl<0UL,_duckdb_re2::Prog::Inst_*,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
           + 8))->_M_head_impl;
  uVar3 = pIVar4[(int)uVar9].out_opcode_;
  uVar15 = uVar3 & 7;
  if (uVar15 == 3) {
    if (pIVar4[(int)uVar9].field_1.cap_ < iVar2) {
      this->match_[pIVar4[(int)uVar9].field_1.cap_] = (char *)pbVar16;
    }
  }
  else if (uVar15 != 6) goto LAB_00415ea7;
  uVar9 = uVar3 >> 4;
  goto LAB_00415e6e;
LAB_00415ea7:
  if (uVar15 == 5) {
    this->match_[1] = (char *)pbVar16;
    this->matched_ = true;
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    poVar11 = std::operator<<((ostream *)local_1a8,"Unexpected opcode in short circuit: ");
    std::ostream::operator<<(poVar11,pIVar4[(int)uVar9].out_opcode_ & 7);
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
  }
LAB_00415efe:
  pIVar12 = (nextq->dense_).ptr_._M_t.
            super___uniq_ptr_impl<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue,_duckdb_re2::PODArray<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue>::Deleter>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue_*,_duckdb_re2::PODArray<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue>::Deleter>
            .
            super__Head_base<0UL,_duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue_*,_false>
            ._M_head_impl;
  pIVar13 = pIVar12;
  for (; pIVar12 != pIVar13 + nextq->size_; pIVar12 = pIVar12 + 1) {
    pTVar10 = pIVar12->value_;
    if ((pTVar10 != (Thread *)0x0) &&
       (iVar2 = (pTVar10->field_0).ref, (pTVar10->field_0).ref = iVar2 + -1, iVar2 < 2)) {
      pTVar10->field_0 = (anon_union_8_2_62753a03_for_Thread_0)this->freelist_;
      this->freelist_ = pTVar10;
    }
    pIVar13 = (nextq->dense_).ptr_._M_t.
              super___uniq_ptr_impl<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue,_duckdb_re2::PODArray<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue>::Deleter>
              ._M_t.
              super__Tuple_impl<0UL,_duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue_*,_duckdb_re2::PODArray<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue>::Deleter>
              .
              super__Head_base<0UL,_duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue_*,_false>
              ._M_head_impl;
  }
  if (this->matched_ != true) {
    return false;
  }
  for (lVar14 = 0; (ulong)(uint)nsubmatch << 4 != lVar14; lVar14 = lVar14 + 0x10) {
    lVar5 = *(long *)((long)this->match_ + lVar14);
    lVar6 = *(long *)((long)this->match_ + lVar14 + 8);
    *(long *)((long)&submatch->data_ + lVar14) = lVar5;
    *(long *)((long)&submatch->size_ + lVar14) = lVar6 - lVar5;
  }
  return true;
}

Assistant:

bool NFA::Search(const StringPiece& text, const StringPiece& const_context,
            bool anchored, bool longest,
            StringPiece* submatch, int nsubmatch) {
  if (start_ == 0)
    return false;

  StringPiece context = const_context;
  if (context.data() == NULL)
    context = text;

  // Sanity check: make sure that text lies within context.
  if (BeginPtr(text) < BeginPtr(context) || EndPtr(text) > EndPtr(context)) {
    LOG(DFATAL) << "context does not contain text";
    return false;
  }

  if (prog_->anchor_start() && BeginPtr(context) != BeginPtr(text))
    return false;
  if (prog_->anchor_end() && EndPtr(context) != EndPtr(text))
    return false;
  anchored |= prog_->anchor_start();
  if (prog_->anchor_end()) {
    longest = true;
    endmatch_ = true;
  }

  if (nsubmatch < 0) {
    LOG(DFATAL) << "Bad args: nsubmatch=" << nsubmatch;
    return false;
  }

  // Save search parameters.
  ncapture_ = 2*nsubmatch;
  longest_ = longest;

  if (nsubmatch == 0) {
    // We need to maintain match[0], both to distinguish the
    // longest match (if longest is true) and also to tell
    // whether we've seen any matches at all.
    ncapture_ = 2;
  }

  match_ = new const char*[ncapture_];
  memset(match_, 0, ncapture_*sizeof match_[0]);
  matched_ = false;

  // For debugging prints.
  btext_ = context.data();
  // For convenience.
  etext_ = text.data() + text.size();

  // Set up search.
  Threadq* runq = &q0_;
  Threadq* nextq = &q1_;
  runq->clear();
  nextq->clear();

  // Loop over the text, stepping the machine.
  for (const char* p = text.data();; p++) {
    // This is a no-op the first time around the loop because runq is empty.
    int id = Step(runq, nextq, p < etext_ ? p[0] & 0xFF : -1, context, p);
    DCHECK_EQ(runq->size(), 0);
    using std::swap;
    swap(nextq, runq);
    nextq->clear();
    if (id != 0) {
      // We're done: full match ahead.
      p = etext_;
      for (;;) {
        Prog::Inst* ip = prog_->inst(id);
        switch (ip->opcode()) {
          default:
            LOG(DFATAL) << "Unexpected opcode in short circuit: " << ip->opcode();
            break;

          case kInstCapture:
            if (ip->cap() < ncapture_)
              match_[ip->cap()] = p;
            id = ip->out();
            continue;

          case kInstNop:
            id = ip->out();
            continue;

          case kInstMatch:
            match_[1] = p;
            matched_ = true;
            break;
        }
        break;
      }
      break;
    }

    if (p > etext_)
      break;

    // Start a new thread if there have not been any matches.
    // (No point in starting a new thread if there have been
    // matches, since it would be to the right of the match
    // we already found.)
    if (!matched_ && (!anchored || p == text.data())) {
      // Try to use prefix accel (e.g. memchr) to skip ahead.
      // The search must be unanchored and there must be zero
      // possible matches already.
      if (!anchored && runq->size() == 0 &&
          p < etext_ && prog_->can_prefix_accel()) {
        p = reinterpret_cast<const char*>(prog_->PrefixAccel(p, etext_ - p));
        if (p == NULL)
          p = etext_;
      }

      Thread* t = AllocThread();
      CopyCapture(t->capture, match_);
      t->capture[0] = p;
      AddToThreadq(runq, start_, p < etext_ ? p[0] & 0xFF : -1, context, p,
                   t);
      Decref(t);
    }

    // If all the threads have died, stop early.
    if (runq->size() == 0) {
      break;
    }

    // Avoid invoking undefined behavior (arithmetic on a null pointer)
    // by simply not continuing the loop.
    // This complements the special case in NFA::Step().
    if (p == NULL) {
      (void) Step(runq, nextq, -1, context, p);
      DCHECK_EQ(runq->size(), 0);
      using std::swap;
      swap(nextq, runq);
      nextq->clear();
      break;
    }
  }

  for (Threadq::iterator i = runq->begin(); i != runq->end(); ++i) {
    if (i->value() != NULL)
      Decref(i->value());
  }

  if (matched_) {
    for (int i = 0; i < nsubmatch; i++)
      submatch[i] =
          StringPiece(match_[2 * i],
                      static_cast<size_t>(match_[2 * i + 1] - match_[2 * i]));
    return true;
  }
  return false;
}